

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::OurReader::readCStyleComment(OurReader *this)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  
  pcVar3 = this->current_;
  do {
    pcVar1 = pcVar3 + 1;
    if (this->end_ <= pcVar1) break;
    this->current_ = pcVar1;
    cVar2 = *pcVar3;
    pcVar3 = pcVar1;
  } while ((cVar2 != '*') || (*pcVar1 != '/'));
  if (pcVar3 != this->end_) {
    this->current_ = pcVar3 + 1;
    return *pcVar3 == '/';
  }
  return false;
}

Assistant:

bool OurReader::readCStyleComment() {
  while ((current_ + 1) < end_) {
    Char c = getNextChar();
    if (c == '*' && *current_ == '/')
      break;
  }
  return getNextChar() == '/';
}